

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *rhs)

{
  long lVar1;
  int64_t iVar2;
  complex<double> *__x;
  complex<double> *__y;
  pointer pcVar3;
  complex<double> local_48;
  long local_38;
  int64_t k;
  int64_t i;
  int64_t j;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> new_data;
  SquareMatrix<std::complex<double>_> *rhs_local;
  SquareMatrix<std::complex<double>_> *this_local;
  
  lVar1 = this->size_;
  new_data._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )rhs;
  iVar2 = size(rhs);
  if (lVar1 == iVar2) {
    init_unique_array<std::complex<double>>((dense *)&j,this->size_ * this->size_);
    for (i = 0; i < this->size_; i = i + 1) {
      for (k = 0; k < this->size_; k = k + 1) {
        for (local_38 = 0; local_38 < this->size_; local_38 = local_38 + 1) {
          __x = operator()(this,k,local_38);
          __y = operator()((SquareMatrix<std::complex<double>_> *)
                           new_data._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl,
                           local_38,i);
          std::operator*(__x,__y);
          pcVar3 = std::
                   unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
                   ::get((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
                          *)&j);
          std::complex<double>::operator+=(pcVar3 + k + i * this->size_,&local_48);
        }
      }
    }
    std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::operator=
              (&this->data_,
               (unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
               &j);
    std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
    ~unique_ptr((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
                &j);
    return this;
  }
  __assert_fail("size_ == rhs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0xb0,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<double>>::operator*=(const SquareMatrix<T> &) [T = std::complex<double>]"
               );
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }